

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# framer.h
# Opt level: O0

void __thiscall Framer::~Framer(Framer *this)

{
  size_type __n;
  ostream *poVar1;
  allocator<char> local_31;
  string local_30 [32];
  Framer *local_10;
  Framer *this_local;
  
  local_10 = this;
  poVar1 = std::operator<<((ostream *)&std::cout,"------------------");
  __n = this->m_length_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_30,__n,'-',&local_31);
  poVar1 = std::operator<<(poVar1,local_30);
  std::operator<<(poVar1,"------------------\n");
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator(&local_31);
  return;
}

Assistant:

~Framer()
    {
        std::cout << "------------------" << std::string(m_length_, '-')
                  << "------------------\n";
    }